

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpair.c
# Opt level: O3

int nn_xpair_events(nn_sockbase *self)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = nn_excl_can_recv((nn_excl *)(self + 1));
  iVar2 = nn_excl_can_send((nn_excl *)(self + 1));
  uVar3 = (iVar1 != 0) + 2;
  if (iVar2 == 0) {
    uVar3 = (uint)(iVar1 != 0);
  }
  return uVar3;
}

Assistant:

static int nn_xpair_events (struct nn_sockbase *self)
{
    struct nn_xpair *xpair;
    int events;

    xpair = nn_cont (self, struct nn_xpair, sockbase);

    events = 0;
    if (nn_excl_can_recv (&xpair->excl))
        events |= NN_SOCKBASE_EVENT_IN;
    if (nn_excl_can_send (&xpair->excl))
        events |= NN_SOCKBASE_EVENT_OUT;
    return events;
}